

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

int rtr_mgr_add_aspa_support(rtr_mgr_config *config,aspa_update_fp aspa_update_fp)

{
  long lVar1;
  aspa_table *aspa_table;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = -1;
  if (config != (rtr_mgr_config *)0x0) {
    aspa_table = (aspa_table *)lrtr_malloc(0x80);
    if (aspa_table != (aspa_table *)0x0) {
      aspa_table_init(aspa_table,aspa_update_fp);
      config->aspa_table = aspa_table;
      iVar2 = 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

RTRLIB_EXPORT int rtr_mgr_add_aspa_support(struct rtr_mgr_config *config, const aspa_update_fp aspa_update_fp)
{
	if (config == NULL) {
		return RTR_ERROR;
	}

	/* Init aspa table that we need to pass to the sockets */
	struct aspa_table *aspa_table = lrtr_malloc(sizeof(*aspa_table));
	if (!aspa_table) {
		return RTR_ERROR;
	}

	aspa_table_init(aspa_table, aspa_update_fp);
	config->aspa_table = aspa_table;

	return RTR_SUCCESS;
}